

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O0

OneofDescriptorProto *
google::protobuf::compiler::StripSourceRetentionOptions
          (OneofDescriptorProto *__return_storage_ptr__,OneofDescriptor *oneof)

{
  FileDescriptor *this;
  DescriptorPool *pool;
  OneofDescriptor *oneof_local;
  OneofDescriptorProto *oneof_proto;
  
  OneofDescriptorProto::OneofDescriptorProto(__return_storage_ptr__);
  OneofDescriptor::CopyTo(oneof,__return_storage_ptr__);
  this = OneofDescriptor::file(oneof);
  pool = FileDescriptor::pool(this);
  anon_unknown_0::ConvertToDynamicMessageAndStripOptions
            (&__return_storage_ptr__->super_Message,pool,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x0);
  return __return_storage_ptr__;
}

Assistant:

OneofDescriptorProto StripSourceRetentionOptions(const OneofDescriptor& oneof) {
  OneofDescriptorProto oneof_proto;
  oneof.CopyTo(&oneof_proto);
  ConvertToDynamicMessageAndStripOptions(oneof_proto, *oneof.file()->pool());
  return oneof_proto;
}